

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O0

bool QFileSystemEngine::setPermissions
               (QFileSystemEntry *entry,Permissions permissions,QSystemError *error)

{
  long lVar1;
  bool bVar2;
  mode_t __mode;
  int iVar3;
  char *__file;
  int *piVar4;
  QFileSystemEntry *in_RDX;
  QFileSystemEntry *in_RDI;
  long in_FS_OFFSET;
  bool success;
  mode_t mode;
  bool local_79;
  QSystemError local_78 [2];
  QFlagsStorage<QFileDevice::Permission> in_stack_ffffffffffffff9c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QFileSystemEntry::isEmpty(in_RDX);
  if (bVar2) {
    piVar4 = __errno_location();
    *piVar4 = 0x16;
    local_79 = false;
  }
  else {
    bVar2 = qIsFilenameBroken(in_RDX);
    if (bVar2) {
      piVar4 = __errno_location();
      *piVar4 = 0x16;
      local_79 = false;
    }
    else {
      __mode = QtPrivate::toMode_t((Permissions)in_stack_ffffffffffffff9c.i);
      QFileSystemEntry::nativeFilePath(in_RDI);
      __file = QByteArray::constData((QByteArray *)0x212ed4);
      iVar3 = chmod(__file,__mode);
      local_79 = iVar3 == 0;
      QByteArray::~QByteArray((QByteArray *)0x212ef4);
      if (!local_79) {
        piVar4 = __errno_location();
        QSystemError::QSystemError(local_78,*piVar4,StandardLibraryError);
        (in_RDX->m_filePath).d.d = (Data *)local_78[0];
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_79;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemEngine::setPermissions(const QFileSystemEntry &entry,
                                       QFile::Permissions permissions, QSystemError &error)
{
    Q_CHECK_FILE_NAME(entry, false);

    mode_t mode = QtPrivate::toMode_t(permissions);
    bool success = ::chmod(entry.nativeFilePath().constData(), mode) == 0;
    if (!success)
        error = QSystemError(errno, QSystemError::StandardLibraryError);
    return success;
}